

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
Lodtalk::EvaluationScope::EvaluationScope(EvaluationScope *this,EvaluationScopePtr *parentScope)

{
  EvaluationScopePtr *parentScope_local;
  EvaluationScope *this_local;
  
  this->_vptr_EvaluationScope = (_func_int **)&PTR__EvaluationScope_0020d328;
  std::shared_ptr<Lodtalk::EvaluationScope>::shared_ptr(&this->parentScope,parentScope);
  return;
}

Assistant:

EvaluationScope::EvaluationScope(const EvaluationScopePtr &parentScope)
	: parentScope(parentScope)
{
}